

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_go_up(command *cmd)

{
  loc_conflict grid;
  _Bool _Var1;
  wchar_t dlev;
  wchar_t ascend_to;
  command *cmd_local;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  _Var1 = square_isupstairs((chunk *)cave,grid);
  if (_Var1) {
    if (((player->opts).opt[0x20] & 1U) == 0) {
      dlev = dungeon_get_next_level(player,(int)player->depth,L'\xffffffff');
      if (dlev == player->depth) {
        msg("You can\'t go up from here!");
      }
      else {
        player->upkeep->energy_use = (uint)z_info->move_energy;
        msgt(0x4e,"You enter a maze of up staircases.");
        player->upkeep->create_up_stair = false;
        player->upkeep->create_down_stair = true;
        dungeon_change_level(player,dlev);
      }
    }
    else {
      msg("Nothing happens!");
    }
  }
  else {
    do_cmd_navigate_up(cmd);
  }
  return;
}

Assistant:

void do_cmd_go_up(struct command *cmd)
{
	int ascend_to;

	/* Verify stairs */
	if (!square_isupstairs(cave, player->grid)) {
		do_cmd_navigate_up(cmd);
		return;
	}

	/* Force descend */
	if (OPT(player, birth_force_descend)) {
		msg("Nothing happens!");
		return;
	}
	
	ascend_to = dungeon_get_next_level(player, player->depth, -1);
	
	if (ascend_to == player->depth) {
		msg("You can't go up from here!");
		return;
	}

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Success */
	msgt(MSG_STAIRS_UP, "You enter a maze of up staircases.");

	/* Create a way back */
	player->upkeep->create_up_stair = false;
	player->upkeep->create_down_stair = true;
	
	/* Change level */
	dungeon_change_level(player, ascend_to);
}